

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

Opcode __thiscall Jinx::Impl::Parser::ParseBinaryOperator(Parser *this)

{
  SymbolType SVar1;
  pointer pSVar2;
  Symbol *pSVar3;
  Opcode OVar4;
  
  if (this->m_error != false) {
    return NumOpcodes;
  }
  pSVar2 = (this->m_currentSymbol)._M_current;
  if (pSVar2 == (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    return NumOpcodes;
  }
  SVar1 = pSVar2->type;
  switch(SVar1) {
  case ForwardSlash:
    OVar4 = Divide;
    break;
  case Asterisk:
    OVar4 = Multiply;
    break;
  case Plus:
    OVar4 = Add;
    break;
  case Minus:
    OVar4 = Subtract;
    break;
  case Equals:
    OVar4 = Equals;
    break;
  case NotEquals:
    OVar4 = NotEquals;
    break;
  case Percent:
    OVar4 = Mod;
    break;
  case LessThan:
    OVar4 = Less;
    break;
  case LessThanEquals:
    OVar4 = LessEq;
    break;
  case GreaterThan:
    OVar4 = Greater;
    break;
  case GreaterThanEquals:
    OVar4 = GreaterEq;
    break;
  case And:
    OVar4 = And;
    break;
  default:
    if (SVar1 == Or) {
      OVar4 = Or;
      break;
    }
  case Comma:
  case ParenOpen:
  case ParenClose:
  case CurlyOpen:
  case CurlyClose:
  case SquareOpen:
  case SquareClose:
  case Ellipse:
  case SingleQuote:
    Error<>(this,"Unknown type when parsing binary operator");
    OVar4 = NumOpcodes;
  }
  pSVar3 = (this->m_currentSymbol)._M_current;
  this->m_lastLine = pSVar3->lineNumber;
  (this->m_currentSymbol)._M_current = pSVar3 + 1;
  return OVar4;
}

Assistant:

inline_t Opcode Parser::ParseBinaryOperator()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return Opcode::NumOpcodes;

		Opcode opcode = Opcode::NumOpcodes;
		switch (m_currentSymbol->type)
		{
		case SymbolType::And:
			opcode = Opcode::And;
			break;
		case SymbolType::Asterisk:
			opcode = Opcode::Multiply;
			break;
		case SymbolType::Equals:
			opcode = Opcode::Equals;
			break;
		case SymbolType::NotEquals:
			opcode = Opcode::NotEquals;
			break;
		case SymbolType::ForwardSlash:
			opcode = Opcode::Divide;
			break;
		case SymbolType::GreaterThan:
			opcode = Opcode::Greater;
			break;
		case SymbolType::GreaterThanEquals:
			opcode = Opcode::GreaterEq;
			break;
		case SymbolType::LessThan:
			opcode = Opcode::Less;
			break;
		case SymbolType::LessThanEquals:
			opcode = Opcode::LessEq;
			break;
		case SymbolType::Minus:
			opcode = Opcode::Subtract;
			break;
		case SymbolType::Or:
			opcode = Opcode::Or;
			break;
		case SymbolType::Percent:
			opcode = Opcode::Mod;
			break;
		case SymbolType::Plus:
			opcode = Opcode::Add;
			break;
		default:
			Error("Unknown type when parsing binary operator");
			break;
		}
		NextSymbol();
		return opcode;
	}